

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O3

void __thiscall ON_SHA1::AccumulateInteger32Array(ON_SHA1 *this,size_t count,ON__INT32 *a)

{
  ON__INT32 *pOVar1;
  ON__INT32 OVar2;
  undefined8 in_RAX;
  ON__INT32 i;
  undefined8 uStack_28;
  
  uStack_28 = CONCAT71((int7)((ulong)in_RAX >> 8),count == 0);
  if ((a != (ON__INT32 *)0x0 && count != 0) && (0 < (long)count)) {
    pOVar1 = a + count;
    do {
      OVar2 = *a;
      a = a + 1;
      uStack_28 = CONCAT44(OVar2,(undefined4)uStack_28);
      Internal_SwapBigEndianUpdate(this,(void *)((long)&uStack_28 + 4),4);
    } while (a < pOVar1);
  }
  return;
}

Assistant:

void ON_SHA1::AccumulateInteger32Array(size_t count, const ON__INT32* a)
{
  if (count > 0 && nullptr != a)
  {
    const ON__INT32* a1 = a + count;
    ON__INT32 i;
    while (a < a1)
    {
      i = *a++;
      Internal_SwapBigEndianUpdate(&i, sizeof(i));
    }
  }
}